

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_list.cpp
# Opt level: O3

unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>,_true> __thiscall
duckdb::SimpleMultiFileList::DynamicFilterPushdown
          (SimpleMultiFileList *this,ClientContext *context,MultiFileOptions *options,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,vector<duckdb::LogicalType,_true> *types,vector<unsigned_long,_true> *column_ids,
          TableFilterSet *filters)

{
  bool bVar1;
  SimpleMultiFileList *this_00;
  TableFilterSet *in_stack_00000010;
  vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> local_60;
  vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> local_48;
  
  if ((*(char *)((long)&(names->
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1) == '\0') &&
     (*(char *)&(names->
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == '\0')) {
    (this->super_MultiFileList)._vptr_MultiFileList = (_func_int **)0x0;
  }
  else {
    ::std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::vector
              (&local_60,
               (vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)
               &(context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    bVar1 = PushdownInternal((ClientContext *)options,(MultiFileOptions *)names,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              *)types,(vector<duckdb::LogicalType,_true> *)column_ids,
                             (vector<unsigned_long,_true> *)filters,in_stack_00000010,
                             (vector<duckdb::OpenFileInfo,_true> *)&local_60);
    if (bVar1) {
      this_00 = (SimpleMultiFileList *)operator_new(0x28);
      ::std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::vector
                (&local_48,&local_60);
      SimpleMultiFileList(this_00,(vector<duckdb::OpenFileInfo,_true> *)&local_48);
      std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector
                ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)&local_48);
    }
    else {
      this_00 = (SimpleMultiFileList *)0x0;
    }
    (this->super_MultiFileList)._vptr_MultiFileList = (_func_int **)this_00;
    std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector
              ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)&local_60);
  }
  return (unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_>)
         (unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_>)this;
}

Assistant:

unique_ptr<MultiFileList>
SimpleMultiFileList::DynamicFilterPushdown(ClientContext &context, const MultiFileOptions &options,
                                           const vector<string> &names, const vector<LogicalType> &types,
                                           const vector<column_t> &column_ids, TableFilterSet &filters) const {
	if (!options.hive_partitioning && !options.filename) {
		return nullptr;
	}

	// FIXME: don't copy list until first file is filtered
	auto file_copy = paths;
	auto res = PushdownInternal(context, options, names, types, column_ids, filters, file_copy);
	if (res) {
		return make_uniq<SimpleMultiFileList>(file_copy);
	}

	return nullptr;
}